

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O1

void __thiscall diy::Collection::destroy(Collection *this,int i)

{
  _Invoker_type p_Var1;
  void *local_18;
  
  local_18 = (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[i];
  if (local_18 == (void *)0x0) {
    if ((this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[i] != -1) {
      (*this->storage_->_vptr_ExternalStorage[4])();
      return;
    }
  }
  else {
    if ((this->destroy_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_M_erase((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)this,(_Link_type)(this->create_).super__Function_base._M_manager);
      p_Var1 = (_Invoker_type)((long)&(this->create_).super__Function_base._M_functor + 8);
      (this->create_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->create_)._M_invoker = p_Var1;
      *(_Invoker_type *)&(this->destroy_).super__Function_base._M_functor = p_Var1;
      *(undefined8 *)((long)&(this->destroy_).super__Function_base._M_functor + 8) = 0;
      return;
    }
    (*(this->destroy_)._M_invoker)((_Any_data *)&this->destroy_,&local_18);
    (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start[i] = (void *)0x0;
  }
  return;
}

Assistant:

void          destroy(int i)                  { if (find(i)) { destroy_(find(i)); elements_[static_cast<size_t>(i)] = 0; } else if (external_[static_cast<size_t>(i)] != -1) storage_->destroy(external_[static_cast<size_t>(i)]); }